

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>::CreateBCGeoEl
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_> *this,int side,int bc)

{
  TPZGeoMesh *pTVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  MElementType MVar5;
  uint uVar6;
  int iVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  TPZGeoEl *gel;
  long lVar9;
  int orientednode;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  TPZManVector<long,_4> nodeindices;
  TPZStack<int,_10> LowAllSides;
  int64_t index;
  TPZGeoElSide BCGelside;
  TPZManVector<int,_27> mapside;
  TPZGeoElSide thisside;
  TPZManVector<long,_4> local_180;
  TPZManVector<int,_10> local_140;
  undefined1 local_f8 [8];
  TPZGeoElSide local_f0;
  TPZManVector<int,_27> local_d8;
  TPZGeoElSide local_48;
  long lVar14;
  
  if ((uint)side < 3) {
    MVar5 = pztopology::TPZLine::Type(side);
    uVar6 = pztopology::TPZLine::NSideNodes(side);
    if (EQuadrilateral < MVar5) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgeoelrefless.h.h"
                 ,0x124);
    }
    lVar10 = *(long *)(&DAT_0151f750 + (ulong)MVar5 * 8);
    local_140.super_TPZVec<int>._vptr_TPZVec._0_4_ = 0;
    TPZManVector<int,_27>::TPZManVector(&local_d8,lVar10,(int *)&local_140);
    auVar2 = _DAT_014d28c0;
    lVar9 = lVar10 + -1;
    auVar12._8_4_ = (int)lVar9;
    auVar12._0_8_ = lVar9;
    auVar12._12_4_ = (int)((ulong)lVar9 >> 0x20);
    lVar9 = 0;
    auVar12 = auVar12 ^ _DAT_014d28c0;
    auVar13 = _DAT_014d28b0;
    do {
      auVar15 = auVar13 ^ auVar2;
      if ((bool)(~(auVar15._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar15._0_4_ ||
                  auVar12._4_4_ < auVar15._4_4_) & 1)) {
        local_d8.super_TPZVec<int>.fStore[lVar9] = (int)lVar9;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        local_d8.super_TPZVec<int>.fStore[lVar9 + 1] = (int)lVar9 + 1;
      }
      lVar9 = lVar9 + 2;
      lVar14 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar14 + 2;
    } while (lVar10 + 1 != lVar9);
    TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_140);
    pztopology::TPZLine::LowerDimensionSides(side,(TPZStack<int,_10> *)&local_140);
    TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_140,side);
    bVar3 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::IsLinearMapping(&this->fGeo,side);
    if (0 < local_140.super_TPZVec<int>.fNElements) {
      lVar10 = 0;
      lVar9 = local_140.super_TPZVec<int>.fNElements;
      do {
        if ((1 < local_140.super_TPZVec<int>.fStore[lVar10]) &&
           (bVar4 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::IsLinearMapping
                              (&this->fGeo,local_140.super_TPZVec<int>.fStore[lVar10]),
           lVar9 = local_140.super_TPZVec<int>.fNElements, !bVar4 || !bVar3)) goto LAB_00e873a4;
        lVar10 = lVar10 + 1;
      } while (lVar10 < lVar9);
    }
    if (bVar3) {
      TPZManVector<long,_4>::TPZManVector(&local_180,(long)(int)uVar6);
      if (0 < (int)uVar6) {
        uVar11 = 0;
        do {
          lVar9 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x128))
                            (this,side,uVar11 & 0xffffffff);
          local_180.super_TPZVec<long>.fStore[uVar11] = lVar9;
          uVar11 = uVar11 + 1;
        } while (uVar6 != uVar11);
      }
      MVar5 = pztopology::TPZLine::Type(side);
      pTVar1 = (this->super_TPZGeoEl).fMesh;
      iVar7 = (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xc])
                        (pTVar1,(ulong)MVar5,&local_180,(ulong)(uint)bc,local_f8,1);
      gel = (TPZGeoEl *)CONCAT44(extraout_var,iVar7);
      TPZGeoElSide::TPZGeoElSide(&local_f0,gel);
      local_48.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
      local_48.fGeoEl = &this->super_TPZGeoEl;
      local_48.fSide = side;
      TPZGeoElSide::InsertConnectivity(&local_f0,&local_48,&local_d8.super_TPZVec<int>);
      (**(code **)(*(long *)gel + 0x78))(gel);
      if (local_180.super_TPZVec<long>.fStore != local_180.fExtAlloc) {
        local_180.super_TPZVec<long>.fNAlloc = 0;
        local_180.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
        if (local_180.super_TPZVec<long>.fStore != (long *)0x0) {
          operator_delete__(local_180.super_TPZVec<long>.fStore);
        }
      }
    }
    else {
LAB_00e873a4:
      gel = (TPZGeoEl *)
            (**(code **)(*(long *)&this->super_TPZGeoEl + 0x2e0))(this,side,bc,&local_d8);
    }
    TPZManVector<int,_10>::~TPZManVector(&local_140);
    if (local_d8.super_TPZVec<int>.fStore != local_d8.fExtAlloc) {
      local_d8.super_TPZVec<int>.fNAlloc = 0;
      local_d8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_d8.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(local_d8.super_TPZVec<int>.fStore);
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n (",3);
    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,")::CreateBCGeoEl unexpected side = ",0x23);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,side);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    gel = (TPZGeoEl *)0x0;
  }
  return gel;
}

Assistant:

TPZGeoEl *
TPZGeoElRefLess<TGeo>::CreateBCGeoEl(int side, int bc){
	// Consistency check
	int nsides = TGeo::NSides;
	if(side<0 || side >= nsides){
		std::cout << "\n ("<<TGeo::Type()<<")::CreateBCGeoEl unexpected side = " << side << "\n";
		return 0;
	}
	if(fGeo.Dimension == 3 && side == nsides-1){
		std::cout <<"\nCreateBCGeoEl not implemented for tridimensional sides \n";
		return 0;
	}
    
    // the side orientation will be +1 if the side is oriented counterclockwise
    // -1 if the side is clockwise
    
    
    int faceSide = 0;
    if (fGeo.Dimension == 2){
        faceSide = side - TGeo::NCornerNodes;
    } else if (fGeo.Dimension == 3){
        faceSide = side - TGeo::NCornerNodes - TGeo::NumSides(1);
    }

    int sideorient = 1;
    switch (TGeo::Type())
    {
    case ETriangle:
        sideorient = pztopology::TPZTriangle::GetSideOrient(faceSide);
        break;
    case EQuadrilateral:
        sideorient = pztopology::TPZQuadrilateral::GetSideOrient(faceSide);
        break;
    case ETetraedro:
        sideorient = pztopology::TPZTetrahedron::GetSideOrient(faceSide);
        break;
    case ECube:
        sideorient = pztopology::TPZCube::GetSideOrient(faceSide);
        break;
    case EPrisma:
        sideorient = pztopology::TPZPrism::GetSideOrient(faceSide);
        break;
    
    default:
        break;
    }
    
    
    // Build vector with node indices of element to be created
    MElementType sidetype = TGeo::Type(side);
    int sidennodes = TGeo::NSideNodes(side);
    int sizeMap = 0;
    switch (sidetype){
    case EPoint:
        sizeMap = 1;
        break;
    case EOned:
        sizeMap = 3;
        break;
    case ETriangle:
        sizeMap = 7;
        break;
    case EQuadrilateral:
        sizeMap = 9;
        break;
    default:
        DebugStop();
    }

    TPZManVector<int,27> mapside(sizeMap,0);
    for(int i=0; i<sizeMap; i++) mapside[i] = i;
    
    if(sideorient == -1)
    {
        switch(sidetype){
            case EOned:
                mapside = {1,0,2};
                break;
            case ETriangle:
                mapside = {0,2,1,5,4,3,6};
                break;
            case EQuadrilateral:
                mapside = {0,3,2,1,7,6,5,4,8};
            default:
                break;
        }
    }

	// Is side straight?
	TPZStack<int> LowAllSides;
	TGeo::LowerDimensionSides(side,LowAllSides);
    LowAllSides.Push(side);
	bool straight = true;
    if(fGeo.IsLinearMapping(side) == false) straight = false;
	for(int lowside = 0; lowside < LowAllSides.NElements(); lowside++)
	{
		int lside = LowAllSides[lowside]; 
		if(lside < TGeo::NNodes) continue;
		if(fGeo.IsLinearMapping(lside) == false) straight = false;
		if(straight == false) break;
	}
	if(straight == false)
	{
		TPZGeoEl *BCGeoEl = CreateBCGeoBlendEl(side,bc,mapside);
		return BCGeoEl;
	}
	
	// else

	TPZManVector<int64_t,4> nodeindices(sidennodes);
	for(int inode = 0; inode < sidennodes; inode++){
        int orientednode = inode;
        if(sideorient == -1) orientednode = mapside[inode];
		nodeindices[orientednode] = this->SideNodeIndex(side,inode);
	}

	// Create GeoElement
	int64_t index;
	MElementType BCtype = TGeo::Type(side);
	TPZGeoEl *BCGeoEl = this->Mesh()->CreateGeoElement(BCtype, nodeindices, bc, index);

    TPZGeoElSide BCGelside(BCGeoEl);
    TPZGeoElSide thisside(this,side);
    BCGelside.InsertConnectivity(thisside,mapside);
    /*
	// Set Connectivity
	int sidensides = TGeo::NContainedSides(side);
	for(int iside=0; iside < sidensides-1; iside++){
		TPZGeoElSide(BCGeoEl,mapside[iside]).SetConnectivity(TPZGeoElSide(this,TGeo::ContainedSideLocId(side,iside)));
	}
	TPZGeoElSide(BCGeoEl, sidensides-1).SetConnectivity(TPZGeoElSide(this,side));
*/
	// Return pointer to new element
	BCGeoEl->Initialize();
	return BCGeoEl;  
}